

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O1

int build_grammar(Grammar *g)

{
  byte *pbVar1;
  VecAction *v;
  Action **ppAVar2;
  uint uVar3;
  AssocKind AVar4;
  TermKind TVar5;
  Term **ppTVar6;
  Production **ppPVar7;
  Elem **ppEVar8;
  Declaration *pDVar9;
  Term *pTVar10;
  State *pSVar11;
  Item *pIVar12;
  Action **ppAVar13;
  int iVar14;
  Production *pPVar15;
  ulong uVar16;
  Elem *pEVar17;
  Rule *pRVar18;
  Production *pPVar19;
  State *pSVar20;
  byte bVar21;
  ulong uVar22;
  Action *pAVar23;
  Term *pTVar24;
  State *pSVar25;
  ulong uVar26;
  uint uVar27;
  char *pcVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  bool bVar33;
  char str [256];
  Production *local_180;
  Production *local_168;
  char local_138 [264];
  
  g->rule_index = 0;
  uVar27 = (g->productions).n;
  uVar22 = (ulong)uVar27;
  if (uVar27 != 0) {
    uVar16 = 0;
    do {
      pPVar19 = (g->productions).v[uVar16];
      pPVar15 = lookup_production(g,pPVar19->name,pPVar19->name_len);
      if (pPVar19 != pPVar15) {
        d_fail("duplicate production \'%s\'");
      }
      pPVar19->index = (uint)uVar16;
      if ((pPVar19->rules).n != 0) {
        uVar22 = 0;
        do {
          pRVar18 = (pPVar19->rules).v[uVar22];
          uVar3 = g->rule_index;
          g->rule_index = uVar3 + 1;
          pRVar18->index = uVar3;
          if ((pRVar18->elems).n == 0) {
            local_168 = (Production *)0x0;
            uVar27 = 0;
          }
          else {
            uVar31 = 0;
            local_168 = (Production *)0x0;
            do {
              pEVar17 = (pRVar18->elems).v[uVar31];
              pEVar17->index = (uint)uVar31;
              if (pEVar17->kind == ELEM_UNRESOLVED) {
                uVar27 = (pEVar17->e).unresolved.len;
                pcVar28 = (char *)(pEVar17->e).term_or_nterm;
                pPVar15 = lookup_production(g,pcVar28,uVar27);
                if (pPVar15 == (Production *)0x0) {
                  uVar30 = (ulong)(g->terminals).n;
                  if (uVar30 == 0) {
                    pPVar15 = (Production *)0x0;
                  }
                  else {
                    ppTVar6 = (g->terminals).v;
                    uVar26 = 0;
                    do {
                      pPVar15 = (Production *)ppTVar6[uVar26];
                      bVar32 = true;
                      if ((*(int *)&pPVar15->name == 3) &&
                         (*(uint *)((pPVar15->rules).e + 1) == uVar27)) {
                        iVar14 = strncmp((char *)(pPVar15->rules).e[0],pcVar28,(long)(int)uVar27);
                        bVar32 = iVar14 != 0;
                        if (!bVar32) {
                          local_180 = pPVar15;
                        }
                      }
                      pPVar15 = local_180;
                      if (!bVar32) goto LAB_0013bef7;
                      uVar26 = uVar26 + 1;
                    } while (uVar30 != uVar26);
                    pPVar15 = (Production *)0x0;
                  }
LAB_0013bef7:
                  if (pPVar15 == (Production *)0x0) {
                    strncpy(local_138,(pEVar17->e).unresolved.string,(ulong)uVar27);
                    uVar30 = 0xff;
                    if (uVar27 < 0xff) {
                      uVar30 = (ulong)uVar27;
                    }
                    local_138[uVar30] = '\0';
                    d_fail("unresolved identifier: \'%s\'",local_138);
                  }
                  else {
                    free(pcVar28);
                    pEVar17->kind = ELEM_TERM;
                    (pEVar17->e).nterm = pPVar15;
                  }
                }
                else {
                  free(pcVar28);
                  pEVar17->kind = ELEM_NTERM;
                  (pEVar17->e).nterm = pPVar15;
                }
              }
              if (pEVar17->kind == ELEM_TERM) {
                local_168 = (pEVar17->e).nterm;
              }
              uVar31 = uVar31 + 1;
              uVar27 = (pRVar18->elems).n;
            } while (uVar31 < uVar27);
          }
          pRVar18->end->index = uVar27;
          if (((g->set_op_priority_from_rule != 0) && (local_168 != (Production *)0x0)) &&
             (pRVar18->rule_assoc != ASSOC_NONE)) {
            *(AssocKind *)&(local_168->rules).v = pRVar18->rule_assoc;
            *(int *)((long)&(local_168->rules).v + 4) = pRVar18->rule_priority;
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 < (pPVar19->rules).n);
      }
      uVar16 = uVar16 + 1;
      uVar22 = (ulong)(g->productions).n;
    } while (uVar16 < uVar22);
  }
  uVar16 = (ulong)(g->terminals).n;
  if (uVar16 != 0) {
    ppTVar6 = (g->terminals).v;
    uVar31 = 0;
    do {
      ppTVar6[uVar31]->index = (uint)uVar31;
      uVar31 = uVar31 + 1;
    } while (uVar16 != uVar31);
  }
  if ((int)uVar22 != 0) {
    ppPVar7 = (g->productions).v;
    uVar16 = 0;
    do {
      pPVar19 = ppPVar7[uVar16];
      uVar31 = (ulong)(pPVar19->rules).n;
      if (uVar31 != 0) {
        uVar30 = 0;
        do {
          pRVar18 = (pPVar19->rules).v[uVar30];
          if ((pRVar18->elems).n == 0) {
            pPVar19->nullable = pRVar18;
            break;
          }
          uVar30 = uVar30 + 1;
        } while (uVar31 != uVar30);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar22);
    uVar16 = 0;
    bVar32 = false;
    do {
      do {
        bVar33 = bVar32;
        pPVar19 = ppPVar7[uVar16];
        if ((pPVar19->nullable == (Rule *)0x0) && ((pPVar19->rules).n != 0)) {
          pRVar18 = *(pPVar19->rules).v;
          uVar31 = (ulong)(pRVar18->elems).n;
          if (uVar31 != 0) {
            uVar30 = 0;
            do {
              pEVar17 = (pRVar18->elems).v[uVar30];
              if ((pEVar17->kind != ELEM_NTERM) || (((pEVar17->e).nterm)->nullable == (Rule *)0x0))
              goto LAB_0013c051;
              uVar30 = uVar30 + 1;
            } while (uVar31 != uVar30);
          }
          pPVar19->nullable = pRVar18;
          bVar33 = true;
        }
LAB_0013c051:
        uVar16 = uVar16 + 1;
        bVar32 = bVar33;
      } while (uVar16 != uVar22);
      uVar16 = 0;
      bVar32 = false;
    } while (bVar33);
  }
  if ((g->productions).n != 0) {
    uVar22 = 0;
    do {
      pPVar19 = (g->productions).v[uVar22];
      if ((pPVar19->field_0x3c & 1) != 0) {
        convert_regex_production_one(g,pPVar19);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < (g->productions).n);
  }
  if ((g->productions).n != 0) {
    uVar22 = 0;
    do {
      pPVar19 = (g->productions).v[uVar22];
      if ((pPVar19->rules).n != 0) {
        uVar16 = 0;
        do {
          pRVar18 = (pPVar19->rules).v[uVar16];
          if ((pRVar18->elems).n != 0) {
            uVar31 = 0;
            do {
              pEVar17 = (pRVar18->elems).v[uVar31];
              if ((pEVar17->kind == ELEM_NTERM) &&
                 (pPVar15 = (Production *)((pEVar17->e).nterm)->regex_term,
                 pPVar15 != (Production *)0x0)) {
                (pEVar17->e).nterm = pPVar15;
                (pRVar18->elems).v[uVar31]->kind = ELEM_TERM;
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 < (pRVar18->elems).n);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < (pPVar19->rules).n);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < (g->productions).n);
  }
  if ((g->productions).n != 0) {
    uVar22 = 0;
    do {
      pPVar19 = (g->productions).v[uVar22];
      if ((pPVar19->rules).n != 0) {
        uVar16 = 0;
        do {
          pRVar18 = (pPVar19->rules).v[uVar16];
          uVar27 = (pRVar18->elems).n;
          if (1 < uVar27) {
            ppEVar8 = (pRVar18->elems).v;
            pEVar17 = *ppEVar8;
            if (pEVar17->kind == ELEM_NTERM) {
              bVar32 = (pEVar17->e).nterm == pPVar19;
            }
            else {
              bVar32 = false;
            }
            pEVar17 = ppEVar8[uVar27 - 1];
            if (pEVar17->kind == ELEM_NTERM) {
              bVar33 = (pEVar17->e).nterm == pPVar19;
            }
            else {
              bVar33 = false;
            }
            AVar4 = pRVar18->rule_assoc;
            if ((AVar4 & 3) == ASSOC_NONE || (AVar4 & 4) == ASSOC_NONE) {
              if ((AVar4 & 0x10) == ASSOC_NONE) {
LAB_0013c1e9:
                if ((AVar4 & 8) == ASSOC_NONE) goto LAB_0013c2d1;
                if ((AVar4 & 2) == ASSOC_NONE || bVar33) {
                  if ((AVar4 & 1) == ASSOC_NONE || bVar32) goto LAB_0013c2d1;
                  pcVar28 = "left unary rule must have left recursive nterm";
                }
                else {
                  pcVar28 = "right unary rule must have right recursive nterm";
                }
              }
              else if ((AVar4 & 2) == ASSOC_NONE || bVar33) {
                if ((AVar4 & 1) == ASSOC_NONE || bVar32) goto LAB_0013c1e9;
                pcVar28 = "left binary rule must have left recursive nterm";
              }
              else {
                pcVar28 = "right binary rule must have right recursive nterm";
              }
              d_fail(pcVar28);
            }
            else if ((bool)(bVar32 & bVar33)) {
              if (AVar4 == ASSOC_NARY_RIGHT) {
                pRVar18->rule_assoc = ASSOC_BINARY_RIGHT;
              }
              else if (AVar4 == ASSOC_NARY_LEFT) {
                pRVar18->rule_assoc = ASSOC_BINARY_LEFT;
              }
            }
            else if (bVar32) {
              if (AVar4 == ASSOC_NARY_RIGHT) {
                d_fail("nary rule with right associativity cannot have left recursive nterm");
              }
              pRVar18->rule_assoc = ASSOC_UNARY_LEFT;
            }
            else if (bVar33) {
              if (AVar4 == ASSOC_NARY_LEFT) {
                d_fail("nary rule with left associativity cannot have right recursive nterm");
              }
              pRVar18->rule_assoc = ASSOC_UNARY_RIGHT;
            }
          }
LAB_0013c2d1:
          uVar16 = uVar16 + 1;
        } while (uVar16 < (pPVar19->rules).n);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < (g->productions).n);
  }
  pPVar19 = *(g->productions).v;
  if (g->tokenizer != 0) {
    pEVar17 = (Elem *)malloc(0x20);
    (pEVar17->e).nterm = (Production *)0x0;
    *(undefined8 *)((long)&pEVar17->e + 8) = 0;
    pEVar17->kind = ELEM_NTERM;
    pEVar17->index = 0;
    pEVar17->rule = (Rule *)0x0;
    (pEVar17->e).nterm = pPVar19;
    pEVar17->rule = (Rule *)0x0;
    new_declaration(g,pEVar17,0);
  }
  if (g->longest_match != 0) {
    pPVar15 = *(g->productions).v;
    pEVar17 = (Elem *)malloc(0x20);
    (pEVar17->e).nterm = (Production *)0x0;
    *(undefined8 *)((long)&pEVar17->e + 8) = 0;
    pEVar17->kind = ELEM_NTERM;
    pEVar17->index = 0;
    pEVar17->rule = (Rule *)0x0;
    (pEVar17->e).nterm = pPVar15;
    pEVar17->rule = (Rule *)0x0;
    new_declaration(g,pEVar17,1);
  }
  if ((g->declarations).n != 0) {
    uVar22 = 0;
    do {
      pEVar17 = (g->declarations).v[uVar22]->elem;
      if (pEVar17->kind == ELEM_UNRESOLVED) {
        uVar3 = (pEVar17->e).unresolved.len;
        if (uVar3 == 0) {
          pPVar15 = *(g->productions).v;
        }
        else {
          pPVar15 = lookup_production(g,(pEVar17->e).unresolved.string,uVar3);
          if (pPVar15 == (Production *)0x0) {
            d_fail("unresolved declaration \'%s\'");
            pPVar15 = (Production *)0x0;
          }
        }
        free((pEVar17->e).term_or_nterm);
        pEVar17->kind = ELEM_NTERM;
        (pEVar17->e).nterm = pPVar15;
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < (g->declarations).n);
  }
  if ((g->declarations).n != 0) {
    uVar22 = 0;
    do {
      pDVar9 = (g->declarations).v[uVar22];
      if (pDVar9->kind < 3) {
        pPVar15 = (pDVar9->elem->e).nterm;
        if (pPVar15 == pPVar19) {
          uVar16 = (ulong)(g->productions).n;
          if (uVar16 != 0) {
            uVar31 = 0;
            do {
              (g->productions).v[uVar31]->declaration_group[(g->declarations).v[uVar22]->kind] =
                   pPVar19;
              pDVar9 = (g->declarations).v[uVar22];
              (g->productions).v[uVar31]->last_declaration[pDVar9->kind] = pDVar9;
              uVar31 = uVar31 + 1;
            } while (uVar16 != uVar31);
          }
        }
        else {
          set_declaration_group(pPVar15,pPVar15,pDVar9);
        }
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < (g->declarations).n);
  }
  if ((g->productions).n != 0) {
    uVar22 = 0;
    do {
      pPVar19 = (g->productions).v[uVar22];
      if ((pPVar19->rules).n != 0) {
        uVar16 = 0;
        do {
          pRVar18 = (pPVar19->rules).v[uVar16];
          if ((pRVar18->elems).n != 0) {
            uVar31 = 0;
            do {
              pEVar17 = (pRVar18->elems).v[uVar31];
              if (pEVar17->kind == ELEM_TERM) {
                if (pPVar19->declaration_group[1] == (Production *)0x0) {
                  if (pPVar19->declaration_group[2] != (Production *)0x0) {
LAB_0013c50c:
                    if (pPVar19->declaration_group[2] == (Production *)0x0) goto LAB_0013c51e;
                  }
                  pbVar1 = (byte *)((long)(((pEVar17->e).nterm)->rules).e + 0xc);
                  *pbVar1 = *pbVar1 & 0xf8;
                }
                else {
                  if (pPVar19->declaration_group[2] == (Production *)0x0) {
                    pPVar15 = (pEVar17->e).nterm;
                    bVar21 = (*(byte *)((long)(pPVar15->rules).e + 0xc) & 0xf8) + 1;
                  }
                  else {
                    if (pPVar19->declaration_group[1] == (Production *)0x0) goto LAB_0013c50c;
LAB_0013c51e:
                    pPVar15 = (pEVar17->e).nterm;
                    bVar21 = *(byte *)((long)(pPVar15->rules).e + 0xc) & 0xf8;
                    if (pPVar19->last_declaration[2]->index < pPVar19->last_declaration[1]->index) {
                      bVar21 = bVar21 | 1;
                    }
                  }
                  *(byte *)((long)(pPVar15->rules).e + 0xc) = bVar21;
                }
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 < (pRVar18->elems).n);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < (pPVar19->rules).n);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < (g->productions).n);
  }
  if ((g->productions).n != 0) {
    uVar22 = 0;
    do {
      pPVar19 = (g->productions).v[uVar22];
      if ((pPVar19->rules).n != 0) {
        uVar16 = 0;
        do {
          pRVar18 = (pPVar19->rules).v[uVar16];
          if ((pRVar18->elems).n != 0) {
            uVar31 = 0;
            do {
              pEVar17 = (pRVar18->elems).v[uVar31];
              if (pEVar17->kind == ELEM_TERM) {
                pTVar10 = (pEVar17->e).term;
                uVar30 = (ulong)(g->terminals).n;
                pTVar24 = pTVar10;
                if (uVar30 != 0) {
                  TVar5 = pTVar10->kind;
                  ppTVar6 = (g->terminals).v;
                  uVar26 = 0;
                  do {
                    pTVar24 = ppTVar6[uVar26];
                    if ((((((TVar5 == pTVar24->kind) && (pTVar10->string_len == pTVar24->string_len)
                           ) && (pTVar10->term_priority == pTVar24->term_priority)) &&
                         (pTVar10->term_name == pTVar24->term_name)) &&
                        ((g->set_op_priority_from_rule == 0 ||
                         ((pTVar10->op_assoc == pTVar24->op_assoc &&
                          (pTVar10->op_priority == pTVar24->op_priority)))))) &&
                       (iVar14 = strncmp(pTVar10->string,pTVar24->string,(long)pTVar10->string_len),
                       iVar14 == 0)) break;
                    uVar26 = uVar26 + 1;
                    pTVar24 = pTVar10;
                  } while (uVar30 != uVar26);
                }
                (pEVar17->e).term = pTVar24;
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 < (pRVar18->elems).n);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < (pPVar19->rules).n);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < (g->productions).n);
  }
  ppPVar7 = (g->productions).v;
  pPVar19 = *ppPVar7;
  uVar22 = (ulong)(g->productions).n;
  if (uVar22 != 0) {
    uVar16 = 0;
    do {
      if ((ppPVar7[uVar16]->field_0x3c & 0x1c) == 0) {
        if (g->states_for_all_nterms == 0) {
          uVar31 = (ulong)(g->declarations).n;
          if (uVar31 != 0) {
            uVar30 = 0;
            do {
              pDVar9 = (g->declarations).v[uVar30];
              if ((pDVar9->kind == 5) && (uVar16 == ((pDVar9->elem->e).nterm)->index))
              goto LAB_0013c70c;
              uVar30 = uVar30 + 1;
            } while (uVar31 != uVar30);
          }
        }
        else {
LAB_0013c70c:
          uVar31 = 0;
          do {
            pPVar15 = ppPVar7[uVar31];
            if ((pPVar15->rules).n != 0) {
              uVar30 = 0;
              do {
                pRVar18 = (pPVar15->rules).v[uVar30];
                uVar26 = (ulong)(pRVar18->elems).n;
                if (uVar26 != 0) {
                  uVar29 = 0;
                  do {
                    pEVar17 = (pRVar18->elems).v[uVar29];
                    if ((pEVar17->e).nterm == ppPVar7[uVar16]) {
                      ppPVar7[uVar16]->elem = pEVar17;
                      break;
                    }
                    uVar29 = uVar29 + 1;
                  } while (uVar26 != uVar29);
                }
                uVar30 = uVar30 + 1;
                pPVar15 = ppPVar7[uVar31];
              } while (uVar30 < (pPVar15->rules).n);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar22);
          pPVar15 = ppPVar7[uVar16];
          pRVar18 = (Rule *)malloc(0xa8);
          memset(pRVar18,0,0xa8);
          pRVar18->prod = pPVar19;
          pEVar17 = (Elem *)malloc(0x20);
          pEVar17->kind = ELEM_NTERM;
          pEVar17->index = 0;
          pEVar17->rule = (Rule *)0x0;
          (pEVar17->e).nterm = (Production *)0x0;
          *(undefined8 *)((long)&pEVar17->e + 8) = 0;
          pRVar18->end = pEVar17;
          pEVar17->kind = ELEM_END;
          pEVar17->rule = pRVar18;
          pRVar18->action_index = g->action_index;
          pEVar17 = (Elem *)malloc(0x20);
          (pEVar17->e).nterm = (Production *)0x0;
          *(undefined8 *)((long)&pEVar17->e + 8) = 0;
          pEVar17->kind = ELEM_NTERM;
          pEVar17->index = 0;
          pEVar17->rule = (Rule *)0x0;
          (pEVar17->e).nterm = pPVar15;
          pEVar17->rule = pRVar18;
          ppPVar7[uVar16]->elem = pEVar17;
          uVar3 = g->rule_index;
          g->rule_index = uVar3 + 1;
          ppPVar7[uVar16]->elem->rule->index = uVar3;
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar22);
  }
  if (((g->states_for_all_nterms == 0) && (g->states_for_whitespace != 0)) &&
     (pPVar15 = lookup_production(g,"whitespace",10), pPVar15 != (Production *)0x0)) {
    pRVar18 = (Rule *)malloc(0xa8);
    memset(pRVar18,0,0xa8);
    pRVar18->prod = pPVar19;
    pEVar17 = (Elem *)malloc(0x20);
    pEVar17->kind = ELEM_NTERM;
    pEVar17->index = 0;
    pEVar17->rule = (Rule *)0x0;
    (pEVar17->e).nterm = (Production *)0x0;
    *(undefined8 *)((long)&pEVar17->e + 8) = 0;
    pRVar18->end = pEVar17;
    pEVar17->kind = ELEM_END;
    pEVar17->rule = pRVar18;
    pRVar18->action_index = g->action_index;
    pEVar17 = (Elem *)malloc(0x20);
    (pEVar17->e).nterm = (Production *)0x0;
    *(undefined8 *)((long)&pEVar17->e + 8) = 0;
    pEVar17->kind = ELEM_NTERM;
    pEVar17->index = 0;
    pEVar17->rule = (Rule *)0x0;
    (pEVar17->e).nterm = pPVar15;
    pEVar17->rule = pRVar18;
    pPVar15->elem = pEVar17;
    uVar3 = g->rule_index;
    g->rule_index = uVar3 + 1;
    pRVar18->index = uVar3;
  }
  pPVar19 = lookup_production(g,"_",1);
  if ((pPVar19 != (Production *)0x0) && (1 < (pPVar19->rules).n)) {
    d_fail("number of rules in default action != 1");
  }
  build_LR_tables(g);
  if ((g->states).n != 0) {
    uVar22 = 0;
    do {
      pSVar25 = (g->states).v[uVar22];
      pSVar25->field_0x178 = pSVar25->field_0x178 & 199 | 0x20;
      uVar22 = uVar22 + 1;
    } while (uVar22 < (g->states).n);
  }
  if ((g->declarations).n != 0) {
    uVar22 = 0;
    do {
      pDVar9 = (g->declarations).v[uVar22];
      if ((pDVar9->kind < 3) && ((g->states).n != 0)) {
        uVar16 = 0;
        pSVar25 = (State *)0x0;
        do {
          pSVar11 = (g->states).v[uVar16];
          pSVar20 = pSVar25;
          if (((pDVar9->kind == 0) && (pSVar20 = pSVar11, pSVar25 != (State *)0x0)) &&
             (pSVar11->same_shifts = pSVar25, pSVar20 = pSVar25, (pSVar11->shift_actions).n != 0)) {
            v = &pSVar25->shift_actions;
            ppAVar2 = (pSVar25->shift_actions).e;
            uVar31 = 0;
            do {
              uVar27 = v->n;
              uVar30 = (ulong)uVar27;
              if (uVar30 != 0) {
                uVar26 = 0;
                do {
                  if ((pSVar11->shift_actions).v[uVar31]->term ==
                      (pSVar25->shift_actions).v[uVar26]->term) goto LAB_0013ca95;
                  uVar26 = uVar26 + 1;
                } while (uVar30 != uVar26);
              }
              ppAVar13 = (pSVar25->shift_actions).v;
              if (ppAVar13 == (Action **)0x0) {
                pAVar23 = (pSVar11->shift_actions).v[uVar31];
                (pSVar25->shift_actions).v = ppAVar2;
                (pSVar25->shift_actions).n = uVar27 + 1;
                (pSVar25->shift_actions).e[uVar30] = pAVar23;
              }
              else {
                if (ppAVar13 == ppAVar2) {
                  if (2 < uVar27) goto LAB_0013ca82;
                  pAVar23 = (pSVar11->shift_actions).v[uVar31];
                }
                else {
                  if ((uVar27 & 7) == 0) {
LAB_0013ca82:
                    vec_add_internal(v,(pSVar11->shift_actions).v[uVar31]);
                    goto LAB_0013ca95;
                  }
                  pAVar23 = (pSVar11->shift_actions).v[uVar31];
                }
                v->n = uVar27 + 1;
                ppAVar13[uVar30] = pAVar23;
              }
LAB_0013ca95:
              uVar31 = uVar31 + 1;
            } while (uVar31 < (pSVar11->shift_actions).n);
          }
          if ((pSVar11->items).n != 0) {
            uVar31 = 0;
            do {
              pIVar12 = (pSVar11->items).v[uVar31];
              if (pIVar12->kind == ELEM_TERM) {
                bVar21 = *(byte *)((long)(((pIVar12->e).nterm)->rules).e + 0xc);
                if ((bVar21 & 7) == 0) {
                  bVar21 = (byte)*(uint *)&pSVar11->field_0x178;
                  if ((*(uint *)&pSVar11->field_0x178 >> 3 & 3) == 0) {
                    bVar21 = bVar21 & 199;
                  }
                  else {
LAB_0013c980:
                    bVar21 = bVar21 & 199 | 0x10;
                  }
                }
                else {
                  if ((bVar21 & 7) != 1) goto LAB_0013c98c;
                  bVar21 = (byte)*(uint *)&pSVar11->field_0x178;
                  uVar27 = *(uint *)&pSVar11->field_0x178 >> 3 & 7;
                  if ((uVar27 != 4) && (uVar27 != 1)) goto LAB_0013c980;
                  bVar21 = bVar21 & 199 | 8;
                }
                pSVar11->field_0x178 = bVar21;
              }
LAB_0013c98c:
              uVar31 = uVar31 + 1;
            } while (uVar31 < (pSVar11->items).n);
          }
          uVar16 = uVar16 + 1;
          pSVar25 = pSVar20;
        } while (uVar16 < (g->states).n);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < (g->declarations).n);
  }
  if ((g->states).n != 0) {
    uVar22 = 0;
    do {
      pSVar25 = (g->states).v[uVar22];
      bVar21 = pSVar25->field_0x178;
      if ((bVar21 & 0x38) == 0x20) {
        pSVar25->field_0x178 = bVar21 & 199;
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < (g->states).n);
  }
  if (d_verbose_level != 0) {
    printf("%d productions %d terminals %d states %d declarations\n",(ulong)(g->productions).n,
           (ulong)(g->terminals).n,(ulong)(g->states).n,(ulong)(g->declarations).n);
  }
  if (1 < d_verbose_level) {
    print_grammar(g);
    print_states(g);
  }
  build_scanners(g);
  build_eq(g);
  return 0;
}

Assistant:

int build_grammar(Grammar *g) {
  resolve_grammar(g);
  convert_regex_productions(g);
  convert_priorities(g);
  propogate_declarations(g);
  merge_identical_terminals(g);
  make_elems_for_productions(g);
  check_default_actions(g);
  build_LR_tables(g);
  map_declarations_to_states(g);
  if (d_verbose_level) {
    printf("%d productions %d terminals %d states %d declarations\n", g->productions.n, g->terminals.n, g->states.n,
           g->declarations.n);
  }
  if (d_verbose_level > 1) {
    print_grammar(g);
    print_states(g);
  }
  build_scanners(g);
  build_eq(g);
  return 0;
}